

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  nk_panel **ppnVar1;
  nk_rect *pnVar2;
  float fVar3;
  nk_color c;
  uint uVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  nk_window *pnVar7;
  nk_scroll *pnVar8;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var9;
  void *pvVar10;
  nk_size nVar11;
  nk_size nVar12;
  nk_size nVar13;
  undefined1 auVar14 [16];
  nk_vec2 nVar15;
  int iVar16;
  int iVar17;
  nk_panel *pnVar18;
  long lVar19;
  uint uVar20;
  nk_window *pnVar21;
  nk_panel *pnVar22;
  uint *puVar23;
  nk_panel_type nVar24;
  nk_page_data *pd;
  nk_page_element *elem;
  nk_context *i;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_rect b_00;
  nk_flags local_13c;
  nk_vec2 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined4 uStack_100;
  undefined4 uStack_fc;
  nk_flags state;
  float fStack_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  nk_rect local_60;
  nk_rect empty_east;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    return;
  }
  pnVar5 = ctx->current;
  if (pnVar5 == (nk_window *)0x0) {
    return;
  }
  if ((pnVar5->flags & 0x1000) != 0) goto LAB_00110906;
  pnVar6 = pnVar5->layout;
  if (pnVar6 == (nk_panel *)0x0) {
    elem = (nk_page_element *)0x0;
  }
  else {
    b = &pnVar5->buffer;
    nVar24 = pnVar6->type;
    uVar20 = pnVar6->flags;
    i = (nk_context *)0x0;
    if ((uVar20 >> 0xb & 1) == 0) {
      i = ctx;
    }
    if ((nVar24 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                  NK_PANEL_GROUP)) == 0) {
      r.w = 16384.0;
      r.h = 16384.0;
      r.x = -8192.0;
      r.y = -8192.0;
      nk_push_scissor(b,r);
      nVar24 = pnVar6->type;
      uVar20 = pnVar6->flags;
    }
    local_138 = (ctx->style).window.scrollbar_size;
    uStack_130 = 0;
    nVar15 = nk_panel_get_padding(&ctx->style,nVar24);
    auVar14._8_4_ = extraout_XMM0_Dc;
    auVar14._0_4_ = nVar15.x;
    auVar14._4_4_ = nVar15.y;
    auVar14._12_4_ = extraout_XMM0_Dd;
    fVar26 = (pnVar6->row).height + pnVar6->at_y;
    pnVar6->at_y = fVar26;
    local_128 = auVar14;
    if ((uVar20 & 0x4400) == 0x400) {
      fVar28 = (pnVar6->bounds).y;
      if (fVar26 < (pnVar6->bounds).h + fVar28) {
        (pnVar6->bounds).h = fVar26 - fVar28;
      }
      local_128._4_4_ = nVar15.y;
      rect.y = fVar28;
      rect.x = (pnVar5->bounds).x;
      rect.h = (float)local_128._4_4_;
      rect.w = (pnVar5->bounds).w;
      nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
      rect_00.w = pnVar6->border + (float)local_128._0_4_;
      rect_00.y = (pnVar6->bounds).y;
      rect_00.x = (pnVar5->bounds).x;
      rect_00.h = (pnVar6->bounds).h;
      nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
      rect_01.x = ((pnVar6->bounds).x + (pnVar6->bounds).w) - pnVar6->border;
      fVar26 = pnVar6->border + (float)local_128._0_4_;
      if ((pnVar6->offset->y == 0) && ((pnVar6->flags & 0x20) == 0)) {
        fVar26 = fVar26 + local_138.x;
      }
      rect_01.y = (pnVar6->bounds).y;
      rect_01.h = (pnVar6->bounds).h;
      rect_01.w = fVar26;
      nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
      uVar20 = pnVar6->flags;
      if ((uVar20 & 0x20) == 0 && pnVar6->offset->x != 0) {
        rect_02.y = (pnVar6->bounds).y + (pnVar6->bounds).h;
        rect_02.x = (pnVar5->bounds).x;
        rect_02.h = local_138.y;
        rect_02.w = (pnVar5->bounds).w;
        nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
        uVar20 = pnVar6->flags;
      }
    }
    if (((uVar20 & 0x4020) == 0) &&
       (pnVar5->scrollbar_hiding_timer <= 4.0 && pnVar5->scrollbar_hiding_timer != 4.0)) {
      _state = _state & 0xffffffff00000000;
      fVar26 = (pnVar6->bounds).y;
      fVar27 = (pnVar6->bounds).x + (pnVar6->bounds).w + (float)local_128._0_4_;
      fVar28 = (pnVar6->bounds).h;
      fVar30 = (float)pnVar6->offset->y;
      fVar32 = fVar28 * 0.01;
      fVar31 = (float)(int)(pnVar6->at_y - fVar26);
      fVar33 = fVar28;
      if ((pnVar6->type &
          (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
          NK_PANEL_GROUP)) == 0) {
        if (pnVar5 == ctx->active) {
          bVar25 = pnVar6->has_scrolling != 0;
        }
        else {
          bVar25 = false;
        }
        if ((i == (nk_context *)0x0) || ((0.0 < (i->input).mouse.scroll_delta & bVar25) == 0)) {
          uVar20 = 0;
        }
        else {
          uVar20 = 1;
          bVar25 = true;
        }
        pnVar5->scrolled = uVar20;
        fVar29 = local_138.x;
      }
      else {
        pnVar22 = pnVar5->layout;
        do {
          pnVar18 = pnVar22;
          pnVar22 = pnVar18->parent;
          pnVar7 = pnVar5;
        } while (pnVar18->parent != (nk_panel *)0x0);
        do {
          pnVar21 = pnVar7;
          pnVar7 = pnVar21->parent;
        } while (pnVar7 != (nk_window *)0x0);
        fVar29 = local_138.x;
        if ((pnVar21 == ctx->active) && (pnVar6->has_scrolling != 0)) {
          local_88 = ZEXT416((uint)fVar28);
          local_b8 = ZEXT416((uint)fVar26);
          local_c8 = ZEXT416((uint)fVar31);
          local_118._0_4_ = fVar32;
          local_d8._0_4_ = fVar30;
          local_e8._4_4_ = fVar28;
          local_e8._0_4_ = local_138.x;
          uStack_e0 = (undefined4)uStack_130;
          uStack_dc = uStack_130._4_4_;
          local_108._4_4_ = fVar26;
          local_108._0_4_ = fVar27;
          _uStack_100 = 0;
          pnVar2 = &pnVar6->bounds;
          local_a8._0_4_ = pnVar2->x;
          local_a8._4_4_ = pnVar2->y;
          local_78._0_4_ = (pnVar6->bounds).w;
          local_78._4_4_ = (pnVar6->bounds).h;
          uStack_a0 = 0;
          uStack_70 = 0;
          local_98 = pnVar5->layout;
          iVar16 = nk_input_is_mouse_hovering_rect(&i->input,*pnVar2);
          fVar27 = (float)local_108._0_4_;
          fVar26 = (float)local_108._4_4_;
          fVar29 = (float)local_e8._0_4_;
          fVar33 = (float)local_e8._4_4_;
          fVar30 = (float)local_d8._0_4_;
          fVar31 = (float)local_c8._0_4_;
          fVar32 = (float)local_118._0_4_;
          if (iVar16 == 0) {
            bVar25 = false;
            goto LAB_0010ff9a;
          }
          fVar3 = (pnVar18->clip).x;
          if ((fVar3 <= (float)local_78 + (float)local_a8) &&
             ((float)local_a8 <= fVar3 + (pnVar18->clip).w)) {
            fVar3 = (pnVar18->clip).y;
            if ((fVar3 <= (float)local_88._0_4_ + (float)local_b8._0_4_) &&
               (pnVar22 = local_98, (float)local_b8._0_4_ <= fVar3 + (pnVar18->clip).h)) {
              do {
                ppnVar1 = &pnVar22->parent;
                pnVar22->has_scrolling = 0;
                bVar25 = true;
                pnVar22 = *ppnVar1;
              } while (*ppnVar1 != (nk_panel *)0x0);
              goto LAB_0010ff9a;
            }
          }
        }
        bVar25 = false;
      }
LAB_0010ff9a:
      scroll.y = fVar26;
      scroll.x = fVar27;
      scroll.h = fVar33;
      scroll.w = fVar29;
      fVar26 = nk_do_scrollbarv(&state,b,scroll,(uint)bVar25,fVar30,fVar31,fVar28 * 0.1,fVar32,
                                &(ctx->style).scrollv,&i->input,(ctx->style).font);
      pnVar8 = pnVar6->offset;
      pnVar8->y = (unsigned_short)(int)fVar26;
      if ((i != (nk_context *)0x0) && (bVar25 != false)) {
        (i->input).mouse.scroll_delta = 0.0;
      }
      local_13c = 0;
      fVar26 = (pnVar6->bounds).x;
      fVar33 = (pnVar6->bounds).y + (pnVar6->bounds).h;
      fVar28 = pnVar6->max_x;
      fVar27 = (float)(int)(fVar28 - fVar26);
      font = (ctx->style).font;
      local_ec = 1.0;
      if (1.0 <= local_138.y) {
        local_ec = local_138.y;
      }
      fVar31 = local_ec + local_ec;
      fVar30 = (pnVar6->bounds).w;
      local_f0 = fVar31;
      if (fVar31 <= fVar30) {
        local_f0 = fVar30;
      }
      _state = CONCAT44(fVar33,fVar26);
      fVar30 = 0.0;
      if (local_f0 < fVar27) {
        fVar30 = (float)pnVar8->x;
        fVar32 = fVar28 * 0.05;
        local_d8 = ZEXT416((uint)fVar27);
        local_108._0_4_ = local_f0;
        local_108._4_4_ = 0;
        uStack_100 = 0;
        uStack_fc = 0;
        local_e8._4_4_ = 0;
        uStack_e0 = 0;
        uStack_dc = 0;
        empty_east.y = fVar33;
        empty_east.h = local_ec;
        if ((ctx->style).scrollh.show_buttons != 0) {
          local_88 = ZEXT416((uint)fVar31);
          local_c8 = ZEXT416((uint)fVar33);
          _local_108 = ZEXT416((uint)local_f0);
          _local_e8 = ZEXT416((uint)fVar26);
          local_a8 = CONCAT44(local_a8._4_4_,fVar32);
          if (fVar28 * 0.005 <= fVar32) {
            fVar32 = fVar28 * 0.005;
          }
          local_b8._0_4_ = fVar32;
          local_118 = ZEXT416((uint)local_ec);
          local_78 = CONCAT44(fVar33,fVar26);
          uStack_70 = 0;
          local_98 = (nk_panel *)CONCAT44(local_ec,local_ec);
          bounds.y = fVar33;
          bounds.x = fVar26;
          bounds.h = local_ec;
          bounds.w = local_ec;
          fStack_90 = local_ec;
          fStack_8c = local_ec;
          iVar16 = nk_do_button_symbol((nk_flags *)&local_60,b,bounds,
                                       (ctx->style).scrollh.dec_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.dec_button,&i->input,font);
          fVar26 = 0.0;
          if (iVar16 != 0) {
            fVar26 = (float)local_b8._0_4_;
          }
          fVar30 = fVar30 - fVar26;
          fVar26 = (float)local_e8._0_4_ + (float)local_108._0_4_;
          local_108._0_4_ = (float)local_108._0_4_ - (float)local_88._0_4_;
          bounds_00.y = (float)local_78._4_4_;
          bounds_00.x = fVar26 - (float)local_118._0_4_;
          bounds_00._8_8_ = local_98;
          iVar16 = nk_do_button_symbol((nk_flags *)&local_60,b,bounds_00,
                                       (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.inc_button,&i->input,font);
          if (iVar16 != 0) {
            fVar30 = fVar30 + (float)local_b8._0_4_;
          }
          fVar26 = (float)local_e8._0_4_ + (float)local_118._0_4_;
          _state = CONCAT44(fStack_f4,fVar26);
          fVar32 = (float)local_a8;
          fVar27 = (float)local_d8._0_4_;
          empty_east.y = (float)local_c8._0_4_;
          empty_east.h = (float)local_118._0_4_;
        }
        if ((float)local_108._0_4_ <= fVar32) {
          fVar32 = (float)local_108._0_4_;
        }
        if (fVar27 - (float)local_108._0_4_ <= fVar30) {
          fVar30 = fVar27 - (float)local_108._0_4_;
        }
        fVar28 = 0.0;
        if (0.0 <= fVar30) {
          fVar28 = fVar30;
        }
        fVar33 = (ctx->style).scrollh.border;
        nVar15 = (ctx->style).scrollh.padding;
        fVar30 = nVar15.x;
        fVar31 = nVar15.y;
        local_60.x = (fVar28 / fVar27) * (float)local_108._0_4_ + fVar26 + fVar33 + fVar30;
        local_60.y = empty_east.y + fVar33 + fVar31;
        local_60.w = ((float)local_108._0_4_ / fVar27) * (float)local_108._0_4_ -
                     (fVar30 + fVar30 + fVar33 + fVar33);
        local_60.h = empty_east.h - (fVar31 + fVar31 + fVar33 + fVar33);
        local_e8._0_4_ = fVar26;
        empty_east.x = local_60.w + local_60.x;
        local_40.w = local_60.x - fVar26;
        empty_east.w = (fVar26 + (float)local_108._0_4_) - empty_east.x;
        local_f0 = (float)local_108._0_4_;
        local_40.x = fVar26;
        local_40.y = empty_east.y;
        local_40.h = empty_east.h;
        fVar26 = nk_scrollbar_behavior
                           (&local_13c,&i->input,0,(nk_rect *)&state,&local_60,&local_40,&empty_east
                            ,fVar28,fVar27,fVar32,NK_HORIZONTAL);
        local_118._0_4_ = fVar26;
        local_60.x = (fVar26 / (float)local_d8._0_4_) * (float)local_108._0_4_ +
                     (float)local_e8._0_4_;
        p_Var9 = (ctx->style).scrollh.draw_begin;
        if (p_Var9 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var9)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
        }
        nk_draw_scrollbar(b,local_13c,&(ctx->style).scrollh,(nk_rect *)&state,&local_60);
        p_Var9 = (ctx->style).scrollh.draw_end;
        if (p_Var9 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var9)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
        }
        fVar30 = (float)local_118._0_4_;
      }
      pnVar6->offset->x = (unsigned_short)(int)fVar30;
    }
    if ((pnVar5->flags & 0x80) == 0) {
LAB_001103c5:
      pnVar5->scrollbar_hiding_timer = 0.0;
    }
    else {
      fVar26 = (ctx->input).mouse.delta.x;
      if ((((fVar26 != 0.0) || (NAN(fVar26))) ||
          (fVar26 = (ctx->input).mouse.delta.y, fVar26 != 0.0)) || (NAN(fVar26))) {
        bVar25 = false;
      }
      else {
        bVar25 = (ctx->input).mouse.scroll_delta == 0.0;
      }
      iVar16 = nk_window_is_hovered(ctx);
      if ((!(bool)(bVar25 & iVar16 != 0)) && (iVar16 != 0 || (ctx->last_widget_state & 2) != 0))
      goto LAB_001103c5;
      pnVar5->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar5->scrollbar_hiding_timer;
    }
    uVar20 = pnVar6->flags;
    if ((uVar20 & 1) != 0) {
      nVar24 = pnVar6->type;
      if (nVar24 == NK_PANEL_TOOLTIP) {
LAB_0011046e:
        lVar19 = 0x1cd4;
      }
      else if (nVar24 == NK_PANEL_POPUP) {
        lVar19 = 0x1cc8;
      }
      else if (nVar24 == NK_PANEL_CONTEXTUAL) {
        lVar19 = 0x1cd0;
      }
      else if (nVar24 == NK_PANEL_COMBO) {
        lVar19 = 0x1ccc;
      }
      else {
        if (nVar24 == NK_PANEL_MENU) goto LAB_0011046e;
        lVar19 = 0x1cc4;
        if (nVar24 == NK_PANEL_GROUP) {
          lVar19 = 0x1cd8;
        }
      }
      c = *(nk_color *)((long)(ctx->style).cursors + lVar19 + -8);
      if ((uVar20 >> 0xe & 1) == 0) {
        if ((uVar20 >> 10 & 1) == 0) {
          fVar26 = (pnVar5->bounds).y;
          fVar28 = (pnVar5->bounds).h + fVar26;
        }
        else {
          fVar28 = (pnVar6->bounds).y + (pnVar6->bounds).h + pnVar6->footer_height;
          fVar26 = (pnVar5->bounds).y;
        }
      }
      else {
        fVar26 = (pnVar5->bounds).y;
        fVar28 = (ctx->style).window.border + fVar26 + pnVar6->header_height;
      }
      fVar27 = (pnVar5->bounds).x;
      nk_stroke_line(b,fVar27,fVar26,(pnVar5->bounds).w + fVar27,fVar26,pnVar6->border,c);
      fVar26 = (pnVar5->bounds).x;
      nk_stroke_line(b,fVar26,fVar28,(pnVar5->bounds).w + fVar26,fVar28,pnVar6->border,c);
      fVar26 = pnVar6->border * 0.5 + (pnVar5->bounds).x;
      nk_stroke_line(b,fVar26,(pnVar5->bounds).y,fVar26,fVar28,pnVar6->border,c);
      fVar26 = ((pnVar5->bounds).x + (pnVar5->bounds).w) - pnVar6->border * 0.5;
      nk_stroke_line(b,fVar26,(pnVar5->bounds).y,fVar26,fVar28,pnVar6->border,c);
      uVar20 = pnVar6->flags;
    }
    if (((uVar20 & 0x4004) == 4) && (i != (nk_context *)0x0)) {
      fVar26 = (pnVar6->bounds).y + (pnVar6->bounds).h;
      local_128._0_4_ = (pnVar6->bounds).x + (pnVar6->bounds).w + (float)local_128._0_4_;
      if ((uVar20 & 0x20) != 0) {
        local_128._0_4_ = (float)local_128._0_4_ - local_138.x;
      }
      local_128._4_4_ = fVar26;
      local_128._8_8_ = 0;
      if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
        r_00.y = fVar26;
        r_00.x = (float)local_128._0_4_;
        r_00.w = local_138.x;
        r_00.h = local_138.y;
        nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
      }
      else {
        nk_fill_triangle(b,local_138.x + (float)local_128._0_4_,fVar26,
                         local_138.x + (float)local_128._0_4_,local_138.y + fVar26,
                         (float)local_128._0_4_,local_138.y + fVar26,
                         (ctx->style).window.scaler.data.color);
      }
      auVar14 = local_128;
      if ((pnVar5->flags & 0x800) == 0) {
        fVar26 = (ctx->style).window.min_size.y;
        iVar16 = (i->input).mouse.buttons[0].down;
        b_00.w = local_138.x;
        b_00.h = local_138.y;
        b_00.x = (float)local_128._0_4_;
        b_00.y = (float)local_128._4_4_;
        local_128 = auVar14;
        iVar17 = nk_input_has_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_00,1);
        uVar20 = pnVar6->flags;
        if ((iVar16 != 0) && (iVar17 != 0)) {
          fVar28 = (i->input).mouse.delta.x;
          fVar33 = (pnVar5->bounds).w + fVar28;
          fVar27 = (ctx->style).window.min_size.x;
          if (fVar33 <= fVar27) {
            fVar33 = fVar27;
          }
          (pnVar5->bounds).w = fVar33;
          if ((uVar20 >> 10 & 1) == 0) {
            fVar27 = (i->input).mouse.delta.y;
            fVar33 = (pnVar5->bounds).h + fVar27;
            if (fVar33 <= fVar26) {
              fVar33 = fVar26;
            }
            (pnVar5->bounds).h = fVar33;
          }
          else {
            fVar27 = (i->input).mouse.delta.y;
          }
          (ctx->style).cursor_active = (ctx->style).cursors[6];
          nVar15.y = (float)local_128._4_4_ + fVar27 + local_138.y * 0.5;
          nVar15.x = (float)local_128._0_4_ + fVar28 + local_138.x * 0.5;
          (i->input).mouse.buttons[0].clicked_pos = nVar15;
        }
      }
      else {
        uVar20 = pnVar6->flags;
      }
    }
    if ((pnVar6->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if ((uVar20 >> 0xc & 1) == 0) {
        (pnVar5->buffer).end = (ctx->memory).allocated;
        pnVar22 = pnVar5->layout;
        if ((pnVar22->popup_buffer).active != 0) {
          pvVar10 = (ctx->memory).memory.ptr;
          nVar11 = (pnVar22->popup_buffer).last;
          nVar12 = (pnVar5->buffer).last;
          nVar13 = (pnVar22->popup_buffer).end;
          *(nk_size *)((long)pvVar10 + (pnVar22->popup_buffer).parent + 8) = nVar13;
          *(undefined8 *)((long)pvVar10 + nVar11 + 8) = *(undefined8 *)((long)pvVar10 + nVar12 + 8);
          *(nk_size *)((long)pvVar10 + nVar12 + 8) = (pnVar22->popup_buffer).begin;
          (pnVar5->buffer).last = nVar11;
          (pnVar5->buffer).end = nVar13;
          (pnVar22->popup_buffer).active = 0;
        }
      }
      else {
        (pnVar5->buffer).last = 0;
        (pnVar5->buffer).begin = 0;
        (pnVar5->buffer).end = 0;
        (pnVar5->buffer).clip = nk_null_rect;
        uVar20 = pnVar6->flags;
      }
    }
    if ((short)uVar20 < 0) {
      uVar20 = uVar20 & 0xffff77ff;
      pnVar6->flags = uVar20;
    }
    pnVar5->flags = uVar20;
    iVar16 = (pnVar5->property).active;
    if (iVar16 == 0) {
      uVar20 = (pnVar5->property).seq;
LAB_00110839:
      (pnVar5->property).old = uVar20;
      (pnVar5->property).prev = iVar16;
      (pnVar5->property).seq = 0;
    }
    else {
      uVar4 = (pnVar5->property).seq;
      uVar20 = (pnVar5->property).old;
      if ((uVar20 == uVar4) || (uVar20 = uVar4, iVar16 != (pnVar5->property).prev))
      goto LAB_00110839;
      nk_zero(&pnVar5->property,0x60);
    }
    iVar16 = (pnVar5->edit).active;
    if (iVar16 == 0) {
      uVar20 = (pnVar5->edit).seq;
LAB_0011088f:
      (pnVar5->edit).old = uVar20;
      (pnVar5->edit).prev = iVar16;
      (pnVar5->edit).seq = 0;
    }
    else {
      uVar4 = (pnVar5->edit).seq;
      uVar20 = (pnVar5->edit).old;
      if ((uVar20 == uVar4) || (uVar20 = uVar4, iVar16 != (pnVar5->edit).prev)) goto LAB_0011088f;
      nk_zero(&pnVar5->edit,0x28);
    }
    if ((pnVar5->popup).active_con == 0) {
      uVar20 = (pnVar5->popup).con_count;
LAB_001108d7:
      puVar23 = &(pnVar5->popup).con_count;
      (pnVar5->popup).con_old = uVar20;
    }
    else {
      uVar20 = (pnVar5->popup).con_old;
      if (uVar20 == (pnVar5->popup).con_count) goto LAB_001108d7;
      puVar23 = &(pnVar5->popup).active_con;
      (pnVar5->popup).con_count = 0;
      (pnVar5->popup).con_old = 0;
    }
    *puVar23 = 0;
    (pnVar5->popup).combo_count = 0;
    elem = (nk_page_element *)ctx->current->layout;
  }
  nk_free_page_element(ctx,elem);
LAB_00110906:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return;
    if (ctx->current->flags & NK_WINDOW_HIDDEN) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}